

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceLocation __thiscall
slang::SourceManager::getFullyExpandedLoc(SourceManager *this,SourceLocation location)

{
  SourceLocation SVar1;
  SourceLocation in_RDI;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> *this_00;
  shared_lock<std::shared_mutex> *in_stack_ffffffffffffffd8;
  SourceManager *in_stack_ffffffffffffffe0;
  
  this_00 = (shared_lock<std::shared_mutex> *)&stack0xffffffffffffffd8;
  std::shared_lock<std::shared_mutex>::shared_lock(this_00,(mutex_type *)in_RDI);
  SVar1 = getFullyExpandedLocImpl<std::shared_lock<std::shared_mutex>_>
                    (in_stack_ffffffffffffffe0,in_RDI,in_stack_ffffffffffffffd8);
  std::shared_lock<std::shared_mutex>::~shared_lock(this_00);
  return SVar1;
}

Assistant:

SourceLocation SourceManager::getFullyExpandedLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    return getFullyExpandedLocImpl(location, lock);
}